

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::updatePivots(HModel *this,int columnIn,int rowOut,int sourceOut)

{
  double dVar1;
  double dVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  int iVar8;
  
  piVar4 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = piVar4[rowOut];
  piVar4[rowOut] = columnIn;
  piVar4 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4[columnIn] = 0;
  piVar5 = (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5[columnIn] = 0;
  pdVar6 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->baseLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[rowOut] = pdVar6[columnIn];
  pdVar7 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->baseUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[rowOut] = pdVar7[columnIn];
  piVar4[iVar3] = 1;
  dVar1 = pdVar6[iVar3];
  dVar2 = pdVar7[iVar3];
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    pdVar6 = (this->workValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (sourceOut == -1) {
      pdVar6[iVar3] = dVar1;
      iVar8 = 1;
    }
    else {
      pdVar6[iVar3] = dVar2;
      iVar8 = -1;
    }
  }
  else {
    (this->workValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar3] = dVar1;
    iVar8 = 0;
  }
  piVar5[iVar3] = iVar8;
  this->countUpdate = this->countUpdate + 1;
  if (iVar3 < this->numCol) {
    this->numBasicLogicals = this->numBasicLogicals + -1;
  }
  if (columnIn < this->numCol) {
    this->numBasicLogicals = this->numBasicLogicals + 1;
  }
  this->mlFg_haveInvert = 0;
  this->mlFg_haveFreshInvert = 0;
  this->mlFg_haveFreshRebuild = 0;
  return;
}

Assistant:

void HModel::updatePivots(int columnIn, int rowOut, int sourceOut) {
  //  printf("Called updatePivots(%d, %d, %d)\n", columnIn, rowOut, sourceOut);cout<<flush;
  int columnOut = basicIndex[rowOut];

  // Incoming variable
  basicIndex[rowOut] = columnIn;
  nonbasicFlag[columnIn] = 0;
  nonbasicMove[columnIn] = 0;
  baseLower[rowOut] = workLower[columnIn];
  baseUpper[rowOut] = workUpper[columnIn];

  // Outgoing variable
  nonbasicFlag[columnOut] = 1;
  if (workLower[columnOut] == workUpper[columnOut]) {
    workValue[columnOut] = workLower[columnOut];
    nonbasicMove[columnOut] = 0;
  } else if (sourceOut == -1) {
    workValue[columnOut] = workLower[columnOut];
    nonbasicMove[columnOut] = 1;
  } else {
    workValue[columnOut] = workUpper[columnOut];
    nonbasicMove[columnOut] = -1;
  }
  
  //  printf("In updatePivots before countUpdate++\n");cout<<flush;
  countUpdate++;
  //  printf("In updatePivots after countUpdate++\n");cout<<flush;
  //Update the number of basic logicals
  if (columnOut < numCol) numBasicLogicals -= 1;
  if (columnIn < numCol) numBasicLogicals += 1;
  //No longer have a representation of B^{-1}, and certainly not fresh!
  mlFg_haveInvert = 0;
  mlFg_haveFreshInvert = 0;
  //Data are no longer fresh from rebuild
  mlFg_haveFreshRebuild = 0;
}